

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

void Curl_conn_ev_data_done(Curl_easy *data,_Bool premature)

{
  undefined7 in_register_00000031;
  void *in_R9;
  
  cf_cntrl_all(data->conn,data,true,7,(int)CONCAT71(in_register_00000031,premature),in_R9);
  return;
}

Assistant:

void Curl_conn_ev_data_done(struct Curl_easy *data, bool premature)
{
  cf_cntrl_all(data->conn, data, TRUE, CF_CTRL_DATA_DONE, premature, NULL);
}